

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_ShaderBlock GPU_GetShaderBlock(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  GPU_Context *pGVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  GPU_ShaderBlock GVar6;
  undefined4 local_18;
  undefined4 uStack_14;
  GPU_ShaderBlock b;
  
  if ((_gpu_current_renderer == (GPU_Renderer *)0x0) ||
     (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) {
    local_18 = 0xffffffff;
    uStack_14 = 0xffffffff;
    b.position_loc = -1;
    b.texcoord_loc = -1;
  }
  else {
    pGVar3 = _gpu_current_renderer->current_context_target->context;
    uVar1 = (pGVar3->current_shader_block).position_loc;
    uVar4 = (pGVar3->current_shader_block).texcoord_loc;
    uVar2 = (pGVar3->current_shader_block).color_loc;
    uVar5 = (pGVar3->current_shader_block).modelViewProjection_loc;
    local_18 = uVar1;
    uStack_14 = uVar4;
    b.position_loc = uVar2;
    b.texcoord_loc = uVar5;
  }
  GVar6.texcoord_loc = uStack_14;
  GVar6.position_loc = local_18;
  GVar6.color_loc = b.position_loc;
  GVar6.modelViewProjection_loc = b.texcoord_loc;
  return GVar6;
}

Assistant:

GPU_ShaderBlock GPU_GetShaderBlock(void)
{
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
    {
        GPU_ShaderBlock b;
        b.position_loc = -1;
        b.texcoord_loc = -1;
        b.color_loc = -1;
        b.modelViewProjection_loc = -1;
        return b;
    }

    return _gpu_current_renderer->current_context_target->context->current_shader_block;
}